

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(stream,"Usage: ");
  poVar1 = std::operator<<(poVar1,program_name);
  std::operator<<(poVar1," [options] imagefile [imagefile ...]\n");
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<(stream,
                    "\nRead exr files to validate their contents and the correct behavior of the software.\n\nOptions:\n  -m            avoid excessive memory allocation (some files will not be fully checked)\n  -t            avoid spending excessive time (some files will not be fully checked)\n  -s            use stream API instead of file API\n  -c            add core library checks\n  -h, --help    print this message\n      --version print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] imagefile [imagefile ...]\n";

    if (verbose)
        stream << "\n"
            "Read exr files to validate their contents and the correct behavior of the software.\n"
            "\n"
            "Options:\n"
            "  -m            avoid excessive memory allocation (some files will not be fully checked)\n"
            "  -t            avoid spending excessive time (some files will not be fully checked)\n"
            "  -s            use stream API instead of file API\n"
            "  -c            add core library checks\n"
            "  -h, --help    print this message\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}